

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O0

void __thiscall henson::Puppet::~Puppet(Puppet *this)

{
  bool bVar1;
  iterator this_00;
  reference ppcVar2;
  Coroutine<henson::Puppet> *in_RDI;
  char *a;
  iterator __end2;
  iterator __begin2;
  vector<char_*,_std::allocator<char_*>_> *__range2;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_18;
  int *local_10;
  
  if (((in_RDI->super_BaseCoroutine).running_ & 1U) != 0) {
    BaseCoroutine::signal_stop(&in_RDI->super_BaseCoroutine);
    Coroutine<henson::Puppet>::proceed(in_RDI);
  }
  local_10 = &in_RDI[1].super_BaseCoroutine.result_;
  local_18._M_current =
       (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(in_stack_ffffffffffffffc8);
  this_00 = std::vector<char_*,_std::allocator<char_*>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
                       in_RDI,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&local_18);
    in_stack_ffffffffffffffc8 = (vector<char_*,_std::allocator<char_*>_> *)*ppcVar2;
    if (in_stack_ffffffffffffffc8 != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
      operator_delete__(in_stack_ffffffffffffffc8);
    }
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&local_18);
  }
  dlclose(in_RDI[1].stack_.ssze);
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)this_00._M_current);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Coroutine<henson::Puppet>::~Coroutine(in_RDI);
  return;
}

Assistant:

~Puppet()
                        {
                            if(running_)
                            {
                                signal_stop();
                                proceed();
                            }

                            for (char* a : argv_)
                                delete[] a;

                            dlclose(lib_);
                        }